

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O2

int main(void)

{
  ostringstream *poVar1;
  bool bVar2;
  OutputWorker *pOVar3;
  long *plVar4;
  SDKResult result;
  uint8_t ping [5];
  string line;
  string local_4f0;
  LogStringBuffer local_4d0;
  char cline [512];
  MyClient client;
  
  MyClient::MyClient(&client);
  bVar2 = MyClient::Initialize(&client);
  if (bVar2) {
    if ((int)Logger.ChannelMinLevel < 2) {
      poVar1 = (ostringstream *)(cline + 0x10);
      cline._0_8_ = Logger.ChannelName;
      cline[8] = '\x01';
      cline[9] = '\0';
      cline[10] = '\0';
      cline[0xb] = '\0';
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,
                      "Press SPACE key to stop server. Any other key will send an advertisement broadcast"
                     );
      pOVar3 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)cline);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    while( true ) {
      plVar4 = (long *)std::istream::getline((char *)&std::cin,(long)cline);
      if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
      std::__cxx11::string::string((string *)&line,cline,(allocator *)&local_4d0);
      if (line._M_string_length == 0) {
        std::__cxx11::string::~string((string *)&line);
        break;
      }
      builtin_memcpy(ping,"d\x01\x02\x03\x04",5);
      std::__cxx11::string::string((string *)&local_4d0,"",(allocator *)&local_4f0);
      result = tonk::SDKSocket::Advertise
                         (&client.super_SDKSocket,(string *)&local_4d0,0x13c4,ping,5);
      std::__cxx11::string::~string((string *)&local_4d0);
      if (result.Result == Tonk_Success) {
        if ((int)Logger.ChannelMinLevel < 3) {
          local_4d0.ChannelName = Logger.ChannelName;
          local_4d0.LogLevel = Info;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4d0.LogStream);
          std::operator<<((ostream *)&local_4d0.LogStream,(string *)&Logger.Prefix);
          std::operator<<((ostream *)&local_4d0.LogStream,"Sent advertisement");
          pOVar3 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar3,&local_4d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4d0.LogStream);
        }
      }
      else {
        tonk::SDKResult::ToString_abi_cxx11_(&local_4f0,&result);
        if ((int)Logger.ChannelMinLevel < 5) {
          local_4d0.ChannelName = Logger.ChannelName;
          local_4d0.LogLevel = Error;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4d0.LogStream);
          std::operator<<((ostream *)&local_4d0.LogStream,(string *)&Logger.Prefix);
          std::operator<<((ostream *)&local_4d0.LogStream,"Advertise failed: ");
          std::operator<<((ostream *)&local_4d0.LogStream,(string *)&local_4f0);
          pOVar3 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar3,&local_4d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4d0.LogStream);
        }
        std::__cxx11::string::~string((string *)&local_4f0);
      }
      std::__cxx11::string::~string((string *)&line);
    }
    if ((int)Logger.ChannelMinLevel < 2) {
      poVar1 = (ostringstream *)(cline + 0x10);
      cline._0_8_ = Logger.ChannelName;
      cline[8] = '\x01';
      cline[9] = '\0';
      cline[10] = '\0';
      cline[0xb] = '\0';
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"...ENTER press detected.  Stopping..");
      pOVar3 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)cline);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
  }
  MyClient::~MyClient(&client);
  if ((int)Logger.ChannelMinLevel < 3) {
    poVar1 = (ostringstream *)(cline + 0x10);
    cline._0_8_ = Logger.ChannelName;
    cline[8] = '\x02';
    cline[9] = '\0';
    cline[10] = '\0';
    cline[0xb] = '\0';
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"Test complete.  *** Timing results:");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)cline);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  test::FunctionTimer::Print((FunctionTimer *)test::t_tonk_connect,1);
  test::FunctionTimer::Print((FunctionTimer *)test::t_tonk_socket_destroy,1);
  test::FunctionTimer::Print((FunctionTimer *)test::t_tonk_send,1);
  test::FunctionTimer::Print((FunctionTimer *)test::t_tonk_flush,1);
  test::FunctionTimer::Print((FunctionTimer *)test::t_tonk_free,1);
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = (ostringstream *)(cline + 0x10);
    cline._0_8_ = Logger.ChannelName;
    cline[8] = '\x01';
    cline[9] = '\0';
    cline[10] = '\0';
    cline[0xb] = '\0';
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"Press ENTER key to terminate");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)cline);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  getchar();
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = (ostringstream *)(cline + 0x10);
    cline._0_8_ = Logger.ChannelName;
    cline[8] = '\x01';
    cline[9] = '\0';
    cline[10] = '\0';
    cline[0xb] = '\0';
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"...Key press detected.  Terminating..");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)cline);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  pOVar3 = logger::OutputWorker::GetInstance();
  logger::OutputWorker::Flush(pOVar3);
  return 0;
}

Assistant:

int main()
{
    {
        MyClient client;
        if (client.Initialize())
        {
            Logger.Debug("Press SPACE key to stop server. Any other key will send an advertisement broadcast");

            for (;;)
            {
                char cline[512];
                if (!std::cin.getline(cline, sizeof(cline))) {
                    break;
                }
                std::string line = cline;
                if (line.empty()) {
                    break;
                }

                // Send ping
                uint8_t ping[kPongBytes] = {
                    ID_Advertise_Ping, 1, 2, 3, 4
                };
                tonk::SDKResult result = client.Advertise(TONK_BROADCAST, kUDPServerPort_Server, ping, kPongBytes);
                if (result) {
                    Logger.Info("Sent advertisement");
                }
                else
                {
                    TONK_CPP_SDK_DEBUG_BREAK();
                    Logger.Error("Advertise failed: ", result.ToString());
                }
            }

            Logger.Debug("...ENTER press detected.  Stopping..");
        }
    }

    Logger.Info("Test complete.  *** Timing results:");

    t_tonk_connect.Print();
    t_tonk_socket_destroy.Print();
    t_tonk_send.Print();
    t_tonk_flush.Print();
    t_tonk_free.Print();

    Logger.Debug("Press ENTER key to terminate");
    ::getchar();
    Logger.Debug("...Key press detected.  Terminating..");

    logger::Flush();

    return 0;
}